

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd-core.c
# Opt level: O2

wchar_t cmd_get_target(command_conflict *cmd,char *arg,int *target)

{
  _Bool _Var1;
  wchar_t wVar2;
  
  wVar2 = cmd_get_arg_target(cmd,arg,target);
  if ((wVar2 == L'\0') && (*target != 0)) {
    if (*target != 5) {
      return L'\0';
    }
    _Var1 = target_okay();
    if (_Var1) {
      return L'\0';
    }
  }
  _Var1 = get_aim_dir(target);
  if (_Var1) {
    cmd_set_arg_target(cmd,arg,*target);
    wVar2 = L'\0';
  }
  else {
    wVar2 = L'\xfffffffd';
  }
  return wVar2;
}

Assistant:

int cmd_get_target(struct command *cmd, const char *arg, int *target)
{
	if (cmd_get_arg_target(cmd, arg, target) == CMD_OK) {
		if (*target != DIR_UNKNOWN &&
				(*target != DIR_TARGET || target_okay()))
			return CMD_OK;
	}

	if (get_aim_dir(target)) {
		cmd_set_arg_target(cmd, arg, *target);
		return CMD_OK;
	}

	return CMD_ARG_ABORTED;
}